

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O2

Fatal * __thiscall wasm::Fatal::operator<<(Fatal *this,char **arg)

{
  std::operator<<((ostream *)&this->field_0x10,*arg);
  return this;
}

Assistant:

Fatal& operator<<(T&& arg) {
    buffer << arg;
    return *this;
  }